

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::lerp
          (LightNodeImpl<embree::SceneGraph::QuadLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  long *plVar41;
  _func_int **pp_Var42;
  long *in_RDX;
  float fVar43;
  
  if (*in_RDX == 0) {
    plVar41 = (long *)0x0;
  }
  else {
    plVar41 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo);
  }
  if (plVar41 != (long *)0x0) {
    (**(code **)(*plVar41 + 0x10))(plVar41);
  }
  pp_Var42 = (_func_int **)alignedMalloc(0xd0,0x10);
  fVar43 = 1.0 - f;
  fVar1 = *(float *)(plVar41 + 0x10);
  fVar2 = *(float *)((long)plVar41 + 0x84);
  fVar3 = *(float *)(plVar41 + 0x11);
  fVar4 = *(float *)((long)plVar41 + 0x8c);
  fVar5 = *(float *)&light1_in[0x10].ptr;
  fVar6 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar7 = *(float *)&light1_in[0x11].ptr;
  fVar8 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar9 = *(float *)(plVar41 + 0x12);
  fVar10 = *(float *)((long)plVar41 + 0x94);
  fVar11 = *(float *)(plVar41 + 0x13);
  fVar12 = *(float *)((long)plVar41 + 0x9c);
  fVar13 = *(float *)&light1_in[0x12].ptr;
  fVar14 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar15 = *(float *)&light1_in[0x13].ptr;
  fVar16 = *(float *)((long)&light1_in[0x13].ptr + 4);
  fVar17 = *(float *)(plVar41 + 0x14);
  fVar18 = *(float *)((long)plVar41 + 0xa4);
  fVar19 = *(float *)(plVar41 + 0x15);
  fVar20 = *(float *)((long)plVar41 + 0xac);
  fVar21 = *(float *)&light1_in[0x14].ptr;
  fVar22 = *(float *)((long)&light1_in[0x14].ptr + 4);
  fVar23 = *(float *)&light1_in[0x15].ptr;
  fVar24 = *(float *)((long)&light1_in[0x15].ptr + 4);
  fVar25 = *(float *)(plVar41 + 0x16);
  fVar26 = *(float *)((long)plVar41 + 0xb4);
  fVar27 = *(float *)(plVar41 + 0x17);
  fVar28 = *(float *)((long)plVar41 + 0xbc);
  fVar29 = *(float *)&light1_in[0x16].ptr;
  fVar30 = *(float *)((long)&light1_in[0x16].ptr + 4);
  fVar31 = *(float *)&light1_in[0x17].ptr;
  fVar32 = *(float *)((long)&light1_in[0x17].ptr + 4);
  fVar33 = *(float *)(plVar41 + 0x18);
  fVar34 = *(float *)((long)plVar41 + 0xc4);
  fVar35 = *(float *)(plVar41 + 0x19);
  fVar36 = *(float *)((long)plVar41 + 0xcc);
  fVar37 = *(float *)&light1_in[0x18].ptr;
  fVar38 = *(float *)((long)&light1_in[0x18].ptr + 4);
  fVar39 = *(float *)&light1_in[0x19].ptr;
  fVar40 = *(float *)((long)&light1_in[0x19].ptr + 4);
  pp_Var42[1] = (_func_int *)0x0;
  pp_Var42[2] = (_func_int *)(pp_Var42 + 4);
  pp_Var42[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var42 + 4) = 0;
  pp_Var42[6] = (_func_int *)(pp_Var42 + 8);
  pp_Var42[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var42 + 8) = 0;
  pp_Var42[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var42 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var42 + 0x5c) = 0xffffffff;
  pp_Var42[0xc] = (_func_int *)0x0;
  *pp_Var42 = (_func_int *)&PTR__Node_002cd090;
  *(undefined4 *)(pp_Var42 + 0xe) = 6;
  *(float *)(pp_Var42 + 0x10) = fVar5 * fVar43 + fVar1 * f;
  *(float *)((long)pp_Var42 + 0x84) = fVar6 * fVar43 + fVar2 * f;
  *(float *)(pp_Var42 + 0x11) = fVar7 * fVar43 + fVar3 * f;
  *(float *)((long)pp_Var42 + 0x8c) = fVar8 * fVar43 + fVar4 * f;
  *(float *)(pp_Var42 + 0x12) = fVar13 * fVar43 + fVar9 * f;
  *(float *)((long)pp_Var42 + 0x94) = fVar14 * fVar43 + fVar10 * f;
  *(float *)(pp_Var42 + 0x13) = fVar15 * fVar43 + fVar11 * f;
  *(float *)((long)pp_Var42 + 0x9c) = fVar16 * fVar43 + fVar12 * f;
  *(float *)(pp_Var42 + 0x14) = fVar21 * fVar43 + fVar17 * f;
  *(float *)((long)pp_Var42 + 0xa4) = fVar22 * fVar43 + fVar18 * f;
  *(float *)(pp_Var42 + 0x15) = fVar23 * fVar43 + fVar19 * f;
  *(float *)((long)pp_Var42 + 0xac) = fVar24 * fVar43 + fVar20 * f;
  *(float *)(pp_Var42 + 0x16) = fVar29 * fVar43 + fVar25 * f;
  *(float *)((long)pp_Var42 + 0xb4) = fVar30 * fVar43 + fVar26 * f;
  *(float *)(pp_Var42 + 0x17) = fVar31 * fVar43 + fVar27 * f;
  *(float *)((long)pp_Var42 + 0xbc) = fVar32 * fVar43 + fVar28 * f;
  *(float *)(pp_Var42 + 0x18) = fVar43 * fVar37 + f * fVar33;
  *(float *)((long)pp_Var42 + 0xc4) = fVar43 * fVar38 + f * fVar34;
  *(float *)(pp_Var42 + 0x19) = fVar43 * fVar39 + f * fVar35;
  *(float *)((long)pp_Var42 + 0xcc) = fVar43 * fVar40 + f * fVar36;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var42;
  LOCK();
  pp_Var42[1] = pp_Var42[1] + 1;
  UNLOCK();
  if (plVar41 != (long *)0x0) {
    (**(code **)(*plVar41 + 0x18))(plVar41);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }